

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Ladder_Monthly.cpp
# Opt level: O0

bool __thiscall RenX_Ladder_Monthly_TimePlugin::initialize(RenX_Ladder_Monthly_TimePlugin *this)

{
  bool bVar1;
  tm *ptVar2;
  basic_string_view<char,_std::char_traits<char>_> bVar3;
  basic_string_view<char,_std::char_traits<char>_> bVar4;
  undefined1 auVar5 [16];
  size_t local_78;
  char *local_70;
  size_t local_68;
  char *local_60;
  size_t local_48;
  char *local_40;
  size_t local_38;
  char *local_30;
  time_t local_18;
  time_t current_time;
  RenX_Ladder_Monthly_TimePlugin *this_local;
  
  current_time = (time_t)this;
  local_18 = time((time_t *)0x0);
  bVar3 = sv("LadderDatabase",0xe);
  bVar4 = sv("Ladder.Monthly.db",0x11);
  local_38 = bVar3._M_len;
  local_30 = bVar3._M_str;
  local_48 = bVar4._M_len;
  local_40 = bVar4._M_str;
  auVar5 = Jupiter::Config::get(&this->field_0x38,local_38,local_30,local_48,local_40);
  Jupiter::Database::process_file(&this->database,auVar5._0_8_,auVar5._8_8_);
  bVar3 = sv("DatabaseName",0xc);
  bVar4 = sv("Monthly",7);
  local_68 = bVar3._M_len;
  local_60 = bVar3._M_str;
  local_78 = bVar4._M_len;
  local_70 = bVar4._M_str;
  auVar5 = Jupiter::Config::get(&this->field_0x38,local_68,local_60,local_78,local_70);
  RenX::LadderDatabase::setName(&this->database,auVar5._0_8_,auVar5._8_8_);
  bVar3 = sv("OutputTimes",0xb);
  Jupiter::Config::get<bool>((Config *)&this->field_0x38,bVar3,false);
  RenX::LadderDatabase::setOutputTimes((bool)((char)this + -0x58));
  ptVar2 = gmtime(&local_18);
  this->last_sorted_month = ptVar2->tm_mon;
  *(code **)&this->field_0xb8 = OnPreUpdateLadder;
  bVar3 = sv("ForceDefault",0xc);
  bVar1 = Jupiter::Config::get<bool>((Config *)&this->field_0x38,bVar3,false);
  if (bVar1) {
    RenX::default_ladder_database = &this->database;
  }
  return true;
}

Assistant:

bool RenX_Ladder_Monthly_TimePlugin::initialize() {
	time_t current_time = time(0);
	// Load database
	this->database.process_file(this->config.get("LadderDatabase"sv, "Ladder.Monthly.db"sv));
	this->database.setName(this->config.get("DatabaseName"sv, "Monthly"sv));
	this->database.setOutputTimes(this->config.get<bool>("OutputTimes"sv, false));

	this->last_sorted_month = gmtime(&current_time)->tm_mon;
	this->database.OnPreUpdateLadder = OnPreUpdateLadder;

	// Force database to default, if desired
	if (this->config.get<bool>("ForceDefault"sv, false)) {
		RenX::default_ladder_database = &this->database;
	}

	return true;
}